

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * get_model_endpoint_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  char *pcVar1;
  string *in_RDI;
  char *endpoint_env;
  char *hf_endpoint_env;
  char *model_endpoint_env;
  string *model_endpoint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  allocator<char> local_22;
  undefined1 local_21;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getenv("MODEL_ENDPOINT");
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)getenv("HF_ENDPOINT");
  local_50 = __s;
  if (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_50 = this;
  }
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)local_50);
  std::allocator<char>::~allocator(&local_22);
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::operator=((string *)in_RDI,(char *)local_50);
    pcVar1 = (char *)std::__cxx11::string::back();
    if (*pcVar1 != '/') {
      std::__cxx11::string::operator+=((string *)in_RDI,'/');
    }
  }
  return in_RDI;
}

Assistant:

std::string get_model_endpoint() {
    const char * model_endpoint_env = getenv("MODEL_ENDPOINT");
    // We still respect the use of environment-variable "HF_ENDPOINT" for backward-compatibility.
    const char * hf_endpoint_env = getenv("HF_ENDPOINT");
    const char * endpoint_env = model_endpoint_env ? model_endpoint_env : hf_endpoint_env;
    std::string model_endpoint = "https://huggingface.co/";
    if (endpoint_env) {
        model_endpoint = endpoint_env;
        if (model_endpoint.back() != '/') model_endpoint += '/';
    }
    return model_endpoint;
}